

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStream_WaitForFrames(PaAlsaStream *self,unsigned_long *framesAvail,int *xrunOccurred)

{
  snd_pcm_t *psVar1;
  snd_pcm_t *psVar2;
  bool bVar3;
  ulong *puVar4;
  int iVar5;
  int *piVar6;
  int queryPlayback;
  uint uVar7;
  uint uVar8;
  PaAlsaStream *pPVar9;
  ulong numFrames;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  pollfd *pfds;
  int pollCapture;
  int pollPlayback;
  int pollTimeout;
  int local_74;
  PaAlsaStream *local_70;
  uint local_64;
  uint local_60;
  int local_5c;
  ulong *local_58;
  PaAlsaStreamComponent *local_50;
  PaAlsaStreamComponent *local_48;
  pollfd *local_40;
  int *local_38;
  
  psVar1 = (self->playback).pcm;
  local_60 = (uint)(psVar1 != (snd_pcm_t *)0x0);
  psVar2 = (self->capture).pcm;
  local_64 = (uint)(psVar2 != (snd_pcm_t *)0x0);
  local_5c = self->pollTimeout;
  local_74 = 0;
  local_38 = xrunOccurred;
  if (framesAvail == (unsigned_long *)0x0) {
    __assert_fail("framesAvail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0xeb2,
                  "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)");
  }
  local_70 = self;
  local_58 = framesAvail;
  if (self->callbackMode == 0) {
    paUtilErr_ = PaAlsaStream_GetAvailableFrames(self,local_64,local_60,framesAvail,&local_74);
    if (paUtilErr_ < 0) {
      pcVar10 = 
      "Expression \'PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3768\n"
      ;
LAB_0010e560:
      PaUtil_DebugPrint(pcVar10);
      uVar7 = paUtilErr_;
      iVar5 = local_74;
      pPVar9 = local_70;
      goto LAB_0010e585;
    }
    pPVar9 = local_70;
    iVar5 = local_74;
    if (local_74 != 0) {
      uVar7 = 0;
      goto LAB_0010e585;
    }
    if (*framesAvail != 0) {
      if ((local_70->capture).pcm != (snd_pcm_t *)0x0) {
        (local_70->capture).ready = 1;
      }
      uVar7 = 0;
      if ((local_70->playback).pcm != (snd_pcm_t *)0x0) {
        (local_70->playback).ready = 1;
      }
      goto LAB_0010e585;
    }
  }
  local_50 = &local_70->capture;
  pPVar9 = local_70;
  if (psVar1 != (snd_pcm_t *)0x0 || psVar2 != (snd_pcm_t *)0x0) {
    local_48 = &local_70->playback;
    uVar8 = 0;
    uVar7 = (uint)(psVar2 != (snd_pcm_t *)0x0);
    uVar11 = (uint)(psVar1 != (snd_pcm_t *)0x0);
    do {
      pthread_testcancel();
      if (uVar7 == 0) {
        local_40 = (pollfd *)0x0;
        if (uVar11 != 0) {
          uVar12 = 0;
          uVar13 = 0;
          goto LAB_0010e20a;
        }
        uVar12 = 0;
LAB_0010e248:
        bVar3 = true;
        pfds = (pollfd *)0x0;
        pPVar9 = local_70;
      }
      else {
        local_40 = pPVar9->pfds;
        PaAlsaStreamComponent_BeginPolling(local_50,local_40);
        paUtilErr_ = 0;
        uVar12 = (pPVar9->capture).nfds;
        uVar13 = (ulong)uVar12;
        if (uVar11 == 0) goto LAB_0010e248;
LAB_0010e20a:
        pPVar9 = local_70;
        pfds = local_70->pfds + uVar13;
        PaAlsaStreamComponent_BeginPolling(local_48,pfds);
        paUtilErr_ = 0;
        uVar12 = uVar12 + (pPVar9->playback).nfds;
        bVar3 = false;
      }
      iVar5 = poll((pollfd *)pPVar9->pfds,(long)(int)uVar12,local_5c);
      pPVar9 = local_70;
      if (iVar5 < 0) {
        piVar6 = __errno_location();
        if (*piVar6 != 4) {
          paUtilErr_ = -0x2702;
          pcVar10 = 
          "Expression \'paInternalError\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3821\n"
          ;
          goto LAB_0010e560;
        }
        Pa_Sleep(1);
        pPVar9 = local_70;
      }
      else {
        if (iVar5 == 0) {
          uVar7 = uVar8 + 1;
          if ((0 < (int)uVar8) && (Pa_Sleep(1), 0x7fe < uVar8)) {
            *local_58 = 0;
            uVar7 = 0;
            iVar5 = 1;
            goto LAB_0010e585;
          }
        }
        else {
          if ((uVar7 != 0) &&
             (paUtilErr_ = PaAlsaStreamComponent_EndPolling
                                     (local_50,local_40,(int *)&local_64,&local_74), paUtilErr_ < 0)
             ) {
            pcVar10 = 
            "Expression \'PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3856\n"
            ;
            goto LAB_0010e560;
          }
          if ((!bVar3) &&
             (paUtilErr_ = PaAlsaStreamComponent_EndPolling
                                     (local_48,pfds,(int *)&local_60,&local_74), paUtilErr_ < 0)) {
            pcVar10 = 
            "Expression \'PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3860\n"
            ;
            goto LAB_0010e560;
          }
          uVar7 = 0;
          pPVar9 = local_70;
          iVar5 = local_74;
          if (local_74 != 0) goto LAB_0010e585;
        }
        uVar8 = uVar7;
        if (((pPVar9->capture).pcm != (snd_pcm_t *)0x0) &&
           ((pPVar9->playback).pcm != (snd_pcm_t *)0x0)) {
          if (local_60 == 0 && local_64 != 0) {
            paUtilErr_ = ContinuePoll(pPVar9,StreamDirection_In,&local_5c,(int *)&local_64);
            if (paUtilErr_ < 0) {
              pcVar10 = 
              "Expression \'ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3876\n"
              ;
              goto LAB_0010e659;
            }
          }
          else if ((local_64 == 0 && local_60 != 0) &&
                  (paUtilErr_ = ContinuePoll(pPVar9,StreamDirection_Out,&local_5c,(int *)&local_60),
                  paUtilErr_ < 0)) {
            pcVar10 = 
            "Expression \'ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3880\n"
            ;
            goto LAB_0010e659;
          }
        }
      }
      uVar7 = local_64;
      uVar11 = local_60;
    } while (local_64 != 0 || local_60 != 0);
    framesAvail = local_58;
    if (local_74 != 0) {
      uVar7 = 0;
      iVar5 = local_74;
      goto LAB_0010e585;
    }
  }
  queryPlayback = 0;
  iVar5 = 0;
  if ((pPVar9->capture).pcm != (snd_pcm_t *)0x0) {
    iVar5 = (pPVar9->capture).ready;
  }
  if ((pPVar9->playback).pcm != (snd_pcm_t *)0x0) {
    queryPlayback = (pPVar9->playback).ready;
  }
  paUtilErr_ = PaAlsaStream_GetAvailableFrames(pPVar9,iVar5,queryPlayback,framesAvail,&local_74);
  puVar4 = local_58;
  if (paUtilErr_ < 0) {
    pcVar10 = 
    "Expression \'PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3894\n"
    ;
LAB_0010e659:
    PaUtil_DebugPrint(pcVar10);
    uVar7 = paUtilErr_;
    iVar5 = local_74;
  }
  else {
    iVar5 = local_74;
    if ((pPVar9->capture).pcm == (snd_pcm_t *)0x0) {
      if ((pPVar9->playback).ready == 0) {
        __assert_fail("self->playback.ready",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0xf47,
                      "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)");
      }
    }
    else {
      if ((pPVar9->playback).pcm != (snd_pcm_t *)0x0) {
        uVar7 = 0;
        if (((pPVar9->playback).ready == 0) && (pPVar9->neverDropInput == 0)) {
          if ((pPVar9->capture).ready == 0) {
            __assert_fail("self->capture.ready",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0xf3d,
                          "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                         );
          }
          uVar13 = (pPVar9->capture).framesPerPeriod;
          numFrames = *local_58;
          if (uVar13 < *local_58) {
            numFrames = uVar13;
          }
          PaAlsaStreamComponent_EndProcessing(local_50,numFrames,&local_74);
          *puVar4 = 0;
          (pPVar9->capture).ready = 0;
          iVar5 = local_74;
        }
        goto LAB_0010e585;
      }
      if ((pPVar9->capture).ready == 0) {
        __assert_fail("self->capture.ready",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0xf45,
                      "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)");
      }
    }
    uVar7 = 0;
  }
LAB_0010e585:
  do {
    if (iVar5 != 0) {
      paUtilErr_ = PaAlsaStream_HandleXrun(pPVar9);
      if (-1 < paUtilErr_) {
        *local_58 = 0;
LAB_0010e5ea:
        *local_38 = iVar5;
        return uVar7;
      }
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_HandleXrun( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3919\n"
                       );
      uVar7 = paUtilErr_;
      goto LAB_0010e585;
    }
    if (((*local_58 == 0) || ((pPVar9->capture).ready != 0)) || ((pPVar9->playback).ready != 0))
    goto LAB_0010e5ea;
    PaUtil_DebugPrint(
                     "Expression \'self->capture.ready || self->playback.ready\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3927\n"
                     );
    uVar7 = 0xffffd8fe;
  } while( true );
}

Assistant:

static PaError PaAlsaStream_WaitForFrames( PaAlsaStream *self, unsigned long *framesAvail, int *xrunOccurred )
{
    PaError result = paNoError;
    int pollPlayback = self->playback.pcm != NULL, pollCapture = self->capture.pcm != NULL;
    int pollTimeout = self->pollTimeout;
    int xrun = 0, timeouts = 0;
    int pollResults;

    assert( self );
    assert( framesAvail );

    if( !self->callbackMode )
    {
        /* In blocking mode we will only wait if necessary */
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL,
                    framesAvail, &xrun ) );
        if( xrun )
        {
            goto end;
        }

        if( *framesAvail > 0 )
        {
            /* Mark pcms ready from poll */
            if( self->capture.pcm )
                self->capture.ready = 1;
            if( self->playback.pcm )
                self->playback.ready = 1;

            goto end;
        }
    }

    while( pollPlayback || pollCapture )
    {
        int totalFds = 0;
        struct pollfd *capturePfds = NULL, *playbackPfds = NULL;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif
        if( pollCapture )
        {
            capturePfds = self->pfds;
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->capture, capturePfds ) );
            totalFds += self->capture.nfds;
        }
        if( pollPlayback )
        {
            /* self->pfds is in effect an array of fds; if necessary, index past the capture fds */
            playbackPfds = self->pfds + (pollCapture ? self->capture.nfds : 0);
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->playback, playbackPfds ) );
            totalFds += self->playback.nfds;
        }

        pollResults = poll( self->pfds, totalFds, pollTimeout );

        if( pollResults < 0 )
        {
            /*  XXX: Depend on preprocessor condition? */
            if( errno == EINTR )
            {
                /* gdb */
                Pa_Sleep( 1 ); /* avoid hot loop */
                continue;
            }

            /* TODO: Add macro for checking system calls */
            PA_ENSURE( paInternalError );
        }
        else if( pollResults == 0 )
        {
           /* Suspended, paused or failed device can provide 0 poll results. To avoid deadloop in such situation
            * we simply run counter 'timeouts' which detects 0 poll result and accumulates. As soon as 2048 timouts (around 2 seconds)
            * are achieved we simply fail function with paTimedOut to notify waiting methods that device is not capable
            * of providing audio data anymore and needs some corresponding recovery action.
            * Note that 'timeouts' is reset to 0 if poll() managed to return non 0 results.
            */

            /*PA_DEBUG(( "%s: poll == 0 results, timed out, %d times left\n", __FUNCTION__, 2048 - timeouts ));*/
            ++ timeouts;
            if( timeouts > 1 ) /* sometimes device times out, but normally once, so we do not sleep any time */
            {
                Pa_Sleep( 1 ); /* avoid hot loop */
            }
            /* not else ! */
            if( timeouts >= 2048 ) /* audio device not working, shall return error to notify waiters */
            {
                *framesAvail = 0; /* no frames available for processing */
                xrun = 1; /* try recovering device */

                PA_DEBUG(( "%s: poll timed out\n", __FUNCTION__, timeouts ));
                goto end;/*PA_ENSURE( paTimedOut );*/
            }
        }
        else if( pollResults > 0 )
        {
            /* reset timouts counter */
            timeouts = 0;

            /* check the return status of our pfds */
            if( pollCapture )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun ) );
            }
            if( pollPlayback )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun ) );
            }
            if( xrun )
            {
                break;
            }
        }

        /* @concern FullDuplex If only one of two pcms is ready we may want to compromise between the two.
         * If there is less than half a period's worth of samples left of frames in the other pcm's buffer we will
         * stop polling.
         */
        if( self->capture.pcm && self->playback.pcm )
        {
            if( pollCapture && !pollPlayback )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture ) );
            }
            else if( pollPlayback && !pollCapture )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback ) );
            }
        }
    }

    if( !xrun )
    {
        /* Get the number of available frames for the pcms that are marked ready.
         * @concern FullDuplex If only one direction is marked ready (from poll), the number of frames available for
         * the other direction is returned. Output is normally preferred over capture however, so capture frames may be
         * discarded to avoid overrun unless paNeverDropInput is specified.
         */
        int captureReady = self->capture.pcm ? self->capture.ready : 0,
            playbackReady = self->playback.pcm ? self->playback.ready : 0;
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun ) );

        if( self->capture.pcm && self->playback.pcm )
        {
            if( !self->playback.ready && !self->neverDropInput )
            {
                /* Drop input, a period's worth */
                assert( self->capture.ready );
                PaAlsaStreamComponent_EndProcessing( &self->capture, PA_MIN( self->capture.framesPerPeriod,
                            *framesAvail ), &xrun );
                *framesAvail = 0;
                self->capture.ready = 0;
            }
        }
        else if( self->capture.pcm )
            assert( self->capture.ready );
        else
            assert( self->playback.ready );
    }

end:
error:
    if( xrun )
    {
        /* Recover from the xrun state */
        PA_ENSURE( PaAlsaStream_HandleXrun( self ) );
        *framesAvail = 0;
    }
    else
    {
        if( 0 != *framesAvail )
        {
            /* If we're reporting frames eligible for processing, one of the handles better be ready */
            PA_UNLESS( self->capture.ready || self->playback.ready, paInternalError );
        }
    }
    *xrunOccurred = xrun;

    return result;
}